

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O0

void * QArrayData::allocate1(QArrayData **dptr,qsizetype capacity,AllocationOption option)

{
  long lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  AllocationResult AVar2;
  AllocationResult r;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AVar2 = allocateHelper((qsizetype)r.data,(qsizetype)dptr,capacity,option);
  uStack_10 = AVar2.header;
  *in_RDI = uStack_10;
  local_18 = AVar2.data;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

void *QArrayData::allocate1(QArrayData **dptr, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);

    auto r = allocateHelper(1, alignof(AlignedQArrayData), capacity, option);
    *dptr = r.header;
    return r.data;
}